

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TokenList * __thiscall
slang::BumpAllocator::emplace<slang::syntax::TokenList,slang::syntax::TokenList_const&>
          (BumpAllocator *this,TokenList *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  TokenList *pTVar4;
  
  pTVar4 = (TokenList *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TokenList *)this->endPtr < pTVar4 + 1) {
    pTVar4 = (TokenList *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pTVar4 + 1);
  }
  (pTVar4->super_SyntaxListBase).super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pTVar4->super_SyntaxListBase).super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pTVar4->super_SyntaxListBase).super_SyntaxNode.field_0x4 = uVar3;
  (pTVar4->super_SyntaxListBase).super_SyntaxNode.parent = pSVar1;
  (pTVar4->super_SyntaxListBase)._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pTVar4->super_SyntaxListBase).childCount = (args->super_SyntaxListBase).childCount;
  sVar2 = (args->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pTVar4->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr =
       (args->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (pTVar4->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent._M_extent_value =
       sVar2;
  (pTVar4->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c81b0;
  return pTVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }